

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_setfenv(lua_State *L)

{
  TValue *pTVar1;
  StkId pTVar2;
  int iVar3;
  TValue *o1;
  ulong uVar4;
  char *extramsg;
  int idx;
  TValue *pTVar5;
  lua_Number lVar6;
  lua_Debug local_90;
  
  luaL_checktype(L,2,5);
  pTVar5 = L->top;
  pTVar1 = L->base;
  if ((pTVar1 != &luaO_nilobject_ && pTVar1 < pTVar5) && (pTVar1->tt == 6)) {
    pTVar5->value = pTVar1->value;
    pTVar5->tt = pTVar1->tt;
    L->top = L->top + 1;
LAB_00109eae:
    pTVar2 = L->top;
    pTVar5 = &luaO_nilobject_;
    if (L->base + 1 < pTVar2) {
      pTVar5 = L->base + 1;
    }
    pTVar2->value = pTVar5->value;
    pTVar2->tt = pTVar5->tt;
    L->top = L->top + 1;
    idx = 1;
    iVar3 = lua_isnumber(L,1);
    if (iVar3 != 0) {
      idx = 1;
      lVar6 = lua_tonumber(L,1);
      if ((lVar6 == 0.0) && (!NAN(lVar6))) {
        pTVar2 = L->top;
        (pTVar2->value).gc = (GCObject *)L;
        pTVar2->tt = 8;
        L->top = L->top + 1;
        iVar3 = -2;
        lua_insert(L,-2);
        lua_setfenv(L,iVar3);
        return 0;
      }
    }
    if (((L->top[-2].tt != 6) || (((L->top[-2].value.gc)->h).flags == '\0')) &&
       (iVar3 = lua_setfenv(L,idx), iVar3 != 0)) {
      return 1;
    }
    luaL_error(L,"\'setfenv\' cannot change environment of given object");
  }
  uVar4 = luaL_checkinteger(L,1);
  if ((int)uVar4 < 0) {
    extramsg = "level must be non-negative";
  }
  else {
    iVar3 = lua_getstack(L,(int)uVar4,&local_90);
    if (iVar3 != 0) {
      lua_getinfo(L,"f",&local_90);
      if (((Node *)L->top != &dummynode_) &&
         (*(int *)((long)&((Node *)L->top)[-1].i_key + 0x10) == 0)) {
        luaL_error(L,"no function environment for tail call at level %d",uVar4 & 0xffffffff);
      }
      goto LAB_00109eae;
    }
    extramsg = "invalid level";
  }
  luaL_argerror(L,1,extramsg);
}

Assistant:

static int luaB_setfenv(lua_State*L){
luaL_checktype(L,2,5);
getfunc(L,0);
lua_pushvalue(L,2);
if(lua_isnumber(L,1)&&lua_tonumber(L,1)==0){
lua_pushthread(L);
lua_insert(L,-2);
lua_setfenv(L,-2);
return 0;
}
else if(lua_iscfunction(L,-2)||lua_setfenv(L,-2)==0)
luaL_error(L,
LUA_QL("setfenv")" cannot change environment of given object");
return 1;
}